

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseResidencyInstance *this)

{
  VkAllocationCallbacks **this_00;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  VkDescriptorPool descriptorPool_00;
  deUint64 dVar2;
  VkQueue pVVar3;
  VkCommandBuffer commandBuffer_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)4>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)8>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  RefData<vk::Handle<(vk::HandleType)19>_> data_07;
  RefData<vk::Handle<(vk::HandleType)14>_> data_08;
  RefData<vk::Handle<(vk::HandleType)16>_> data_09;
  RefData<vk::Handle<(vk::HandleType)18>_> data_10;
  RefData<vk::Handle<(vk::HandleType)21>_> data_11;
  RefData<vk::Handle<(vk::HandleType)22>_> data_12;
  bool bVar4;
  uint uVar5;
  VkResult result;
  int iVar6;
  InstanceInterface *vk;
  MovePtr *vk_00;
  Queue *pQVar7;
  Queue *pQVar8;
  VkDevice pVVar9;
  Handle<(vk::HandleType)8> *pHVar10;
  NotSupportedError *pNVar11;
  Checked<vk::Handle<(vk::HandleType)7>_> object;
  size_type sVar12;
  reference pBinds;
  Allocator *pAVar13;
  reference pvVar14;
  Allocation *pAVar15;
  void *dst;
  VkDeviceMemory memory;
  VkDeviceSize VVar16;
  Handle<(vk::HandleType)24> *pHVar17;
  VkCommandBuffer_s **ppVVar18;
  DescriptorSetLayoutBuilder *pDVar19;
  ProgramCollection<vk::ProgramBinary> *this_01;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar20;
  Handle<(vk::HandleType)16> *pHVar21;
  Handle<(vk::HandleType)14> *pHVar22;
  Handle<(vk::HandleType)18> *pHVar23;
  DescriptorPoolBuilder *this_02;
  Handle<(vk::HandleType)21> *pHVar24;
  Handle<(vk::HandleType)22> *pHVar25;
  DescriptorSetUpdateBuilder *pDVar26;
  Handle<(vk::HandleType)4> *pWaitSemaphores;
  ulong uVar27;
  MovePtr *pMVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  uint local_11d4;
  allocator<char> local_ef1;
  string local_ef0;
  allocator<char> local_ec9;
  string local_ec8;
  allocator<char> local_ea1;
  string local_ea0;
  uint local_e80;
  uint local_e7c;
  deUint32 size;
  deUint32 offset;
  deUint32 alignment;
  deUint32 sparseBindNdx_1;
  deUint8 *outputData;
  VkPipelineStageFlags local_e5c;
  VkBuffer VStack_e58;
  VkPipelineStageFlags waitStageBits [1];
  undefined1 local_e50 [8];
  VkBufferMemoryBarrier outputBufferBarrier;
  undefined1 local_e08 [8];
  VkBufferCopy bufferCopy;
  undefined1 local_de8 [8];
  VkBufferMemoryBarrier sparseBufferBarrier;
  undefined1 local_da8 [8];
  VkBufferMemoryBarrier inputBufferBarrier;
  Location local_d68;
  VkDescriptorSet local_d60;
  Location local_d58;
  VkDescriptorSet local_d50;
  DescriptorSetUpdateBuilder local_d48;
  deUint64 local_d00;
  undefined1 local_cf8 [8];
  VkDescriptorBufferInfo sparseBufferInfo;
  undefined1 local_cd8 [8];
  VkDescriptorBufferInfo inputBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_cb0;
  RefData<vk::Handle<(vk::HandleType)22>_> local_c90;
  undefined1 local_c70 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_c38;
  RefData<vk::Handle<(vk::HandleType)21>_> local_c18;
  undefined1 local_bf8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_bc0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_ba0;
  undefined1 local_b80 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> computePipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_b58;
  RefData<vk::Handle<(vk::HandleType)16>_> local_b38;
  undefined1 local_b18 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_af0;
  Move<vk::Handle<(vk::HandleType)14>_> local_ad0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_ab0;
  undefined1 local_a90 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)19>_> local_a28;
  RefData<vk::Handle<(vk::HandleType)19>_> local_a08;
  undefined1 local_9e8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Move<vk::VkCommandBuffer_s_*> local_9c0;
  RefData<vk::VkCommandBuffer_s_*> local_9a0;
  undefined1 local_980 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_940;
  undefined1 local_920 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_8f0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_8e0;
  undefined1 local_8d0 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_8a0;
  undefined1 local_880 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> outputBuffer;
  VkBufferCreateInfo outputBufferCreateInfo;
  uint local_81c;
  undefined1 local_818 [4];
  deUint32 valueNdx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_7f0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_7e0;
  undefined1 local_7d0 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_7a0;
  undefined1 local_780 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> inputBuffer;
  VkBufferCreateInfo inputBufferCreateInfo;
  undefined4 local_720 [2];
  VkBindSparseInfo bindSparseInfo;
  undefined1 local_6b8 [8];
  VkSparseBufferMemoryBindInfo sparseBufferBindInfo;
  undefined8 uStack_698;
  VkAllocationCallbacks *local_690;
  Move<vk::Handle<(vk::HandleType)7>_> local_678;
  value_type local_658;
  undefined1 local_648 [8];
  VkSparseMemoryBind sparseMemoryBind;
  deUint32 sparseBindNdx;
  string local_610;
  deUint32 local_5ec;
  undefined1 local_5e8 [4];
  deUint32 memoryType;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> sparseMemoryBinds;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  deUint32 numSparseSlots;
  undefined1 local_5a8 [8];
  VkMemoryRequirements bufferMemRequirements;
  RefData<vk::Handle<(vk::HandleType)4>_> local_570;
  undefined1 local_550 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> bufferMemoryBindSemaphore;
  RefData<vk::Handle<(vk::HandleType)8>_> local_510;
  undefined1 local_4f0 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> sparseBuffer;
  deUint32 queueFamilyIndices [2];
  VkBufferCreateInfo bufferCreateInfo;
  Queue *computeQueue;
  Queue *sparseQueue;
  DeviceInterface *deviceInterface;
  QueueRequirements local_470;
  undefined1 local_468 [8];
  QueueRequirementsVec queueRequirements;
  VkPhysicalDeviceFeatures local_43c;
  undefined1 local_360 [8];
  VkPhysicalDeviceProperties physicalDeviceProperties;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  BufferSparseResidencyInstance *this_local;
  
  vk = Context::getInstanceInterface
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDeviceProperties._816_8_ =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)local_360,vk,
             (VkPhysicalDevice)physicalDeviceProperties._816_8_);
  ::vk::getPhysicalDeviceFeatures(&local_43c,vk,(VkPhysicalDevice)physicalDeviceProperties._816_8_);
  if (local_43c.sparseResidencyBuffer == 0) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Sparse partially resident buffers not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0x90);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *)
         local_468);
  QueueRequirements::QueueRequirements(&local_470,8,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_468,&local_470);
  QueueRequirements::QueueRequirements((QueueRequirements *)&deviceInterface,2,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_468,(value_type *)&deviceInterface);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_468);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  ~vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *
          )local_468);
  vk_00 = (MovePtr *)
          SparseResourcesBaseInstance::getDeviceInterface(&this->super_SparseResourcesBaseInstance);
  pQVar7 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  pQVar8 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  queueFamilyIndices[0] = 0xc;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
       pQVar7->queueFamilyIndex;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_ =
       pQVar8->queueFamilyIndex;
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  this_00 = &bufferMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
             m_allocator;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this_00,(DeviceInterface *)vk_00,pVVar9
                     ,(VkBufferCreateInfo *)queueFamilyIndices,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_510,(Move *)this_00);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_510.deleter.m_deviceIface;
  data_01.object.m_internal = local_510.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_510.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_510.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_510.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_510.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_4f0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
              .m_allocator);
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&bufferMemRequirements.memoryTypeBits,
             (DeviceInterface *)vk_00,pVVar9,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_570,(Move *)&bufferMemRequirements.memoryTypeBits);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_570.deleter.m_deviceIface;
  data_02.object.m_internal = local_570.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_570.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_570.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_570.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_570.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_550,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&bufferMemRequirements.memoryTypeBits);
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_5a8,(DeviceInterface *)vk_00,pVVar9,
             (VkBuffer)pHVar10->m_internal);
  if (physicalDeviceProperties.limits.bufferImageGranularity < (ulong)local_5a8) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Required memory size for sparse resources exceeds device limits",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
               ,0xbf);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  uVar5 = (uint)((ulong)local_5a8 / bufferMemRequirements.size);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            *)&sparseMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)local_5e8);
  local_5ec = findMatchingMemoryType
                        (vk,(VkPhysicalDevice)physicalDeviceProperties._816_8_,
                         (VkMemoryRequirements *)local_5a8,
                         (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  if (local_5ec == 0xffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_610,"No matching memory type found",
               (allocator<char> *)((long)&sparseBindNdx + 3));
    tcu::TestStatus::fail(__return_storage_ptr__,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sparseBindNdx + 3));
    bVar4 = true;
  }
  else {
    for (sparseMemoryBind._36_4_ = 0; (uint)sparseMemoryBind._36_4_ < uVar5;
        sparseMemoryBind._36_4_ = sparseMemoryBind._36_4_ + 2) {
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)local_648,(DeviceInterface *)vk_00,pVVar9,
                 bufferMemRequirements.size,local_5ec,
                 bufferMemRequirements.size * (uint)sparseMemoryBind._36_4_);
      object = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)sparseMemoryBind.size);
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&sparseBufferBindInfo.pBinds,
                 (DeviceInterface *)vk_00,pVVar9,(VkAllocationCallbacks *)0x0);
      deleter.m_device._0_4_ = (int)uStack_698;
      deleter.m_deviceIface = (DeviceInterface *)sparseBufferBindInfo.pBinds;
      deleter.m_device._4_4_ = (int)((ulong)uStack_698 >> 0x20);
      deleter.m_allocator = local_690;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::Move<vk::Handle<(vk::HandleType)7>>
                ((Move<vk::Handle<(vk::HandleType)7>> *)&local_678,object,deleter);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_658,&local_678);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                   *)&sparseMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_658);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr(&local_658)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_678);
      std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                 local_5e8,(value_type *)local_648);
    }
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
    bindSparseInfo.pSignalSemaphores = (VkSemaphore *)pHVar10->m_internal;
    sVar12 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::size
                       ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        local_5e8);
    pBinds = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
             operator[]((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        local_5e8,0);
    ::vk::makeSparseBufferMemoryBindInfo
              ((VkSparseBufferMemoryBindInfo *)local_6b8,(VkBuffer)bindSparseInfo.pSignalSemaphores,
               (deUint32)sVar12,pBinds);
    local_720[0] = 7;
    bindSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bindSparseInfo._4_4_ = 0;
    bindSparseInfo.pNext._0_4_ = 0;
    bindSparseInfo.waitSemaphoreCount = 0;
    bindSparseInfo._20_4_ = 0;
    bindSparseInfo.pWaitSemaphores._0_4_ = 1;
    bindSparseInfo._32_8_ = local_6b8;
    bindSparseInfo.pBufferBinds._0_4_ = 0;
    bindSparseInfo.imageOpaqueBindCount = 0;
    bindSparseInfo._52_4_ = 0;
    bindSparseInfo.pImageOpaqueBinds._0_4_ = 0;
    bindSparseInfo.imageBindCount = 0;
    bindSparseInfo._68_4_ = 0;
    bindSparseInfo.pImageBinds._0_4_ = 1;
    bindSparseInfo._80_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_550);
    pVVar3 = pQVar7->queueHandle;
    ::vk::Handle<(vk::HandleType)6>::Handle
              ((Handle<(vk::HandleType)6> *)&inputBufferCreateInfo.pQueueFamilyIndices,0);
    result = (*(*(_func_int ***)vk_00)[0x11])
                       (vk_00,pVVar3,1,local_720,inputBufferCreateInfo.pQueueFamilyIndices);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseResidency.cpp"
                      ,0xe8);
    bVar4 = false;
  }
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)local_5e8);
  if (!bVar4) {
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
               ,(ulong)this->m_bufferSize,0x20);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)vk_00,pVVar9,
                       (VkBufferCreateInfo *)
                       &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_7a0,
               (Move *)&inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar29 = SUB84(local_7a0.deleter.m_deviceIface,0);
    uVar30 = (undefined4)((ulong)local_7a0.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_deviceIface._0_4_ = uVar29;
    data_03.object.m_internal = local_7a0.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = uVar30;
    data_03.deleter.m_device = local_7a0.deleter.m_device;
    data_03.deleter.m_allocator._0_4_ = (int)local_7a0.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_7a0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_780,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar13 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_780);
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar28 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7f0,
               (DeviceInterface *)vk_00,pVVar9,pAVar13,(VkBuffer)pHVar10->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_7e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_7f0,pMVar28);
    data._8_4_ = uVar29;
    data.ptr = (Allocation *)local_7a0.object.m_internal;
    data._12_4_ = uVar30;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7d0,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7f0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
               (ulong)this->m_bufferSize);
    for (local_81c = 0; local_81c < this->m_bufferSize; local_81c = local_81c + 1) {
      uVar27 = (ulong)local_81c % bufferMemRequirements.size;
      pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
                           (ulong)local_81c);
      *pvVar14 = (char)uVar27 + '\x01';
    }
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_7d0);
    dst = ::vk::Allocation::getHostPtr(pAVar15);
    pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,0);
    ::deMemcpy(dst,pvVar14,(ulong)this->m_bufferSize);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_7d0);
    memory = ::vk::Allocation::getMemory(pAVar15);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_7d0);
    VVar16 = ::vk::Allocation::getOffset(pAVar15);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)vk_00,pVVar9,memory,VVar16,(ulong)this->m_bufferSize);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator,(ulong)this->m_bufferSize,2);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)vk_00,pVVar9,
                       (VkBufferCreateInfo *)
                       &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_8a0,
               (Move *)&outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar29 = SUB84(local_8a0.deleter.m_deviceIface,0);
    uVar30 = (undefined4)((ulong)local_8a0.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_deviceIface._0_4_ = uVar29;
    data_04.object.m_internal = local_8a0.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = uVar30;
    data_04.deleter.m_device = local_8a0.deleter.m_device;
    data_04.deleter.m_allocator._0_4_ = (int)local_8a0.deleter.m_allocator;
    data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_8a0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_880,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar13 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_880);
    commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
         ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar28 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8f0,
               (DeviceInterface *)vk_00,pVVar9,pAVar13,(VkBuffer)pHVar10->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_8e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_8f0,pMVar28);
    data_00._8_4_ = uVar29;
    data_00.ptr = (Allocation *)local_8a0.object.m_internal;
    data_00._12_4_ = uVar30;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d0,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8f0);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                    &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    (DeviceInterface *)vk_00,pVVar9,pQVar8->queueFamilyIndex);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_940,
               (Move *)&commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_940.deleter.m_deviceIface;
    data_05.object.m_internal = local_940.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_940.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device = local_940.deleter.m_device;
    data_05.deleter.m_allocator._0_4_ = (int)local_940.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_940.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_920,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_920);
    descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar17->m_internal;
    ::vk::allocateCommandBuffer
              (&local_9c0,(DeviceInterface *)vk_00,pVVar9,
               (VkCommandPool)
               descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
               m_allocator,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_9a0,(Move *)&local_9c0);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_9a0.deleter.m_deviceIface;
    data_06.object = local_9a0.object;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_9a0.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device = local_9a0.deleter.m_device;
    data_06.deleter.m_pool.m_internal._0_4_ = (int)local_9a0.deleter.m_pool.m_internal;
    data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_9a0.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_980,data_06);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_9c0);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar18);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    pDVar19 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                        ((DescriptorSetLayoutBuilder *)
                         &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
                          .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
    pDVar19 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                        (pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorSetLayoutBuilder::build(&local_a28,pDVar19,(DeviceInterface *)vk_00,pVVar9,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a08,(Move *)&local_a28);
    data_07.deleter.m_deviceIface._0_4_ = (int)local_a08.deleter.m_deviceIface;
    data_07.object.m_internal = local_a08.object.m_internal;
    data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a08.deleter.m_deviceIface >> 0x20);
    data_07.deleter.m_device = local_a08.deleter.m_device;
    data_07.deleter.m_allocator._0_4_ = (int)local_a08.deleter.m_allocator;
    data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_a08.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_9e8,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_a28);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)
               &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                m_allocator);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    this_01 = Context::getBinaryCollection
                        ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"comp",
               (allocator<char> *)
               ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                       m_allocator + 7));
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,&local_af0);
    ::vk::createShaderModule(&local_ad0,(DeviceInterface *)vk_00,pVVar9,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ab0,(Move *)&local_ad0);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_ab0.deleter.m_deviceIface;
    data_08.object.m_internal = local_ab0.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ab0.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device = local_ab0.deleter.m_device;
    data_08.deleter.m_allocator._0_4_ = (int)local_ab0.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_ab0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a90,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_ad0);
    std::__cxx11::string::~string((string *)&local_af0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                       m_allocator + 7));
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_9e8);
    computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar20->m_internal;
    makePipelineLayout(&local_b58,(DeviceInterface *)vk_00,pVVar9,
                       (VkDescriptorSetLayout)
                       computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter
                       .m_allocator);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_b38,(Move *)&local_b58);
    data_09.deleter.m_deviceIface._0_4_ = (int)local_b38.deleter.m_deviceIface;
    data_09.object.m_internal = local_b38.object.m_internal;
    data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b38.deleter.m_deviceIface >> 0x20);
    data_09.deleter.m_device = local_b38.deleter.m_device;
    data_09.deleter.m_allocator._0_4_ = (int)local_b38.deleter.m_allocator;
    data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_b38.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_b18,data_09);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_b58);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_b18);
    pipelineLayout_00.m_internal = pHVar21->m_internal;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a90);
    makeComputePipeline(&local_bc0,(DeviceInterface *)vk_00,pVVar9,pipelineLayout_00,
                        (VkShaderModule)pHVar22->m_internal,(VkSpecializationInfo *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_ba0,(Move *)&local_bc0);
    data_10.deleter.m_deviceIface._0_4_ = (int)local_ba0.deleter.m_deviceIface;
    data_10.object.m_internal = local_ba0.object.m_internal;
    data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ba0.deleter.m_deviceIface >> 0x20);
    data_10.deleter.m_device = local_ba0.deleter.m_device;
    data_10.deleter.m_allocator._0_4_ = (int)local_ba0.deleter.m_allocator;
    data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_ba0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_b80,data_10);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_bc0);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    pVVar1 = *ppVVar18;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_b80);
    descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar23->m_internal;
    (*(*(_func_int ***)vk_00)[0x4c])
              (vk_00,pVVar1,1,
               descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
               m_allocator);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    this_02 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)
                         &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                          deleter.m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorPoolBuilder::build(&local_c38,this_02,(DeviceInterface *)vk_00,pVVar9,1,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c18,(Move *)&local_c38);
    data_11.deleter.m_deviceIface._0_4_ = (int)local_c18.deleter.m_deviceIface;
    data_11.object.m_internal = local_c18.object.m_internal;
    data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c18.deleter.m_deviceIface >> 0x20);
    data_11.deleter.m_device = local_c18.deleter.m_device;
    data_11.deleter.m_allocator._0_4_ = (int)local_c18.deleter.m_allocator;
    data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_c18.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_bf8,data_11);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_c38);
    ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
              ((DescriptorPoolBuilder *)
               &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_bf8);
    descriptorPool_00.m_internal = pHVar24->m_internal;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_9e8);
    inputBufferInfo.range = pHVar20->m_internal;
    makeDescriptorSet(&local_cb0,(DeviceInterface *)vk_00,pVVar9,descriptorPool_00,
                      (VkDescriptorSetLayout)inputBufferInfo.range);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_c90,(Move *)&local_cb0);
    data_12.deleter.m_deviceIface._0_4_ = (int)local_c90.deleter.m_deviceIface;
    data_12.object.m_internal = local_c90.object.m_internal;
    data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c90.deleter.m_deviceIface >> 0x20);
    data_12.deleter.m_device = local_c90.deleter.m_device;
    data_12.deleter.m_pool.m_internal._0_4_ = (int)local_c90.deleter.m_pool.m_internal;
    data_12.deleter.m_pool.m_internal._4_4_ = (int)(local_c90.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_c70,data_12);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_cb0);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_780);
    sparseBufferInfo.range = pHVar10->m_internal;
    ::vk::makeDescriptorBufferInfo
              ((VkDescriptorBufferInfo *)local_cd8,(VkBuffer)sparseBufferInfo.range,0,
               (ulong)this->m_bufferSize);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
    local_d00 = pHVar10->m_internal;
    ::vk::makeDescriptorBufferInfo
              ((VkDescriptorBufferInfo *)local_cf8,(VkBuffer)local_d00,0,(ulong)this->m_bufferSize);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_d48);
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_c70);
    local_d50.m_internal = pHVar25->m_internal;
    local_d58 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar26 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_d48,local_d50,&local_d58,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                         (VkDescriptorBufferInfo *)local_cd8);
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_c70);
    local_d60.m_internal = pHVar25->m_internal;
    local_d68 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    pDVar26 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (pDVar26,local_d60,&local_d68,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                         (VkDescriptorBufferInfo *)local_cf8);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar26,(DeviceInterface *)vk_00,pVVar9);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_d48);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    pVVar1 = *ppVVar18;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_b18);
    inputBufferBarrier.size = pHVar21->m_internal;
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_c70);
    (*(*(_func_int ***)vk_00)[0x56])(vk_00,pVVar1,1,inputBufferBarrier.size,0,1,pHVar25,0,0);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_780);
    sparseBufferBarrier.size = pHVar10->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_da8,0x4000,0x20,(VkBuffer)sparseBufferBarrier.size,0,
               (ulong)this->m_bufferSize);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar18,0x4000,0x800,0,0,0,1,local_da8,0,0);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    (*(*(_func_int ***)vk_00)[0x5d])(vk_00,*ppVVar18,1,1);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
    bufferCopy.size = pHVar10->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_de8,0x40,0x800,(VkBuffer)bufferCopy.size,0,
               (ulong)this->m_bufferSize);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar18,0x800,0x1000,0,0,0,1,local_de8,0,0);
    ::vk::makeBufferCopy((VkBufferCopy *)local_e08,0,0,(ulong)this->m_bufferSize);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    pVVar1 = *ppVVar18;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
    dVar2 = pHVar10->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_880);
    outputBufferBarrier.size = pHVar10->m_internal;
    (*(*(_func_int ***)vk_00)[0x5f])(vk_00,pVVar1,dVar2,outputBufferBarrier.size,1,local_e08);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_880);
    VStack_e58.m_internal = pHVar10->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_e50,0x1000,0x2000,VStack_e58,0,
               (ulong)this->m_bufferSize);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar18,0x1000,0x4000,0,0,0,1,local_e50,0,0);
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    endCommandBuffer((DeviceInterface *)vk_00,*ppVVar18);
    local_e5c = 0x1000;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pVVar3 = pQVar8->queueHandle;
    ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
    commandBuffer_00 = *ppVVar18;
    pWaitSemaphores =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_550);
    submitCommandsAndWait
              ((DeviceInterface *)vk_00,pVVar9,pVVar3,commandBuffer_00,1,pWaitSemaphores,&local_e5c,
               0,(VkSemaphore *)0x0);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_8d0);
    outputData = (deUint8 *)::vk::Allocation::getMemory(pAVar15);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_8d0);
    VVar16 = ::vk::Allocation::getOffset(pAVar15);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk_00,pVVar9,(VkDeviceMemory)outputData,VVar16,
               (ulong)this->m_bufferSize);
    pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_8d0);
    _alignment = ::vk::Allocation::getHostPtr(pAVar15);
    (*(*(_func_int ***)vk_00)[3])(vk_00,pQVar7->queueHandle);
    for (offset = 0; offset < uVar5; offset = offset + 1) {
      size = (deUint32)bufferMemRequirements.size;
      local_e7c = size * offset;
      local_11d4 = size;
      if (offset == uVar5 - 1) {
        local_11d4 = (uint)((ulong)this->m_bufferSize % (bufferMemRequirements.size & 0xffffffff));
      }
      local_e80 = local_11d4;
      if ((offset & 1) == 0) {
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
                             (ulong)local_e7c);
        iVar6 = deMemCmp(pvVar14,(void *)((long)_alignment + (ulong)local_e7c),(ulong)local_e80);
        if (iVar6 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ea0,"Failed",&local_ea1);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_ea0);
          std::__cxx11::string::~string((string *)&local_ea0);
          std::allocator<char>::~allocator(&local_ea1);
          goto LAB_00d93b52;
        }
      }
      else if (physicalDeviceProperties.sparseProperties.residencyStandard3DBlockShape != 0) {
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
                             (ulong)local_e7c);
        ::deMemset(pvVar14,0,(ulong)local_e80);
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818,
                             (ulong)local_e7c);
        iVar6 = deMemCmp(pvVar14,(void *)((long)_alignment + (ulong)local_e7c),(ulong)local_e80);
        if (iVar6 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ec8,"Failed",&local_ec9);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_ec8);
          std::__cxx11::string::~string((string *)&local_ec8);
          std::allocator<char>::~allocator(&local_ec9);
          goto LAB_00d93b52;
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef0,"Passed",&local_ef1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_ef0);
    std::__cxx11::string::~string((string *)&local_ef0);
    std::allocator<char>::~allocator(&local_ef1);
LAB_00d93b52:
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_c70);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_bf8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_b80);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_b18);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a90);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_9e8);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_980);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_920);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_8d0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_880);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_818);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7d0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_780);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
             *)&sparseMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_550);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_4f0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&		 instance					= m_context.getInstanceInterface();
	const VkPhysicalDevice			 physicalDevice				= m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties physicalDeviceProperties	= getPhysicalDeviceProperties(instance, physicalDevice);

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse partially resident buffers not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
		VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,	// VkBufferCreateFlags	flags;
		m_bufferSize,							// VkDeviceSize			size;
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT |
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,		// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		0u,										// deUint32				queueFamilyIndexCount;
		DE_NULL									// const deUint32*		pQueueFamilyIndices;
	};

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirements = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirements.size % bufferMemRequirements.alignment) == 0);

	const deUint32				numSparseSlots = static_cast<deUint32>(bufferMemRequirements.size / bufferMemRequirements.alignment);
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>		sparseMemoryBinds;
		const deUint32						memoryType		= findMatchingMemoryType(instance, physicalDevice, bufferMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; sparseBindNdx += 2)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirements.alignment, memoryType, bufferMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, static_cast<deUint32>(sparseMemoryBinds.size()), &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create input buffer
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));


	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	// Create output buffer
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	// Create command buffer for compute and data transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording compute and transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	{
		const VkDescriptorBufferInfo inputBufferInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, m_bufferSize);
		const VkDescriptorBufferInfo sparseBufferInfo = makeDescriptorBufferInfo(*sparseBuffer, 0ull, m_bufferSize);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &inputBufferInfo)
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &sparseBufferInfo)
			.update(deviceInterface, getDevice());
	}

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_SHADER_READ_BIT,
										*inputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	deviceInterface.cmdDispatch(*commandBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_SHADER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0ull,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording compute and transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseSlots; ++sparseBindNdx)
	{
		const deUint32 alignment = static_cast<deUint32>(bufferMemRequirements.alignment);
		const deUint32 offset	 = alignment * sparseBindNdx;
		const deUint32 size		 = sparseBindNdx == (numSparseSlots - 1) ? m_bufferSize % alignment : alignment;

		if (sparseBindNdx % 2u == 0u)
		{
			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
		else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
		{
			deMemset(&referenceData[offset], 0u, size);

			if (deMemCmp(&referenceData[offset], outputData + offset, size) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}